

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int bbSPIXfer(uint CS,char *inBuf,char *outBuf,uint count)

{
  wfRx_t *w;
  uint uVar1;
  FILE *pFVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  
  pFVar2 = _stderr;
  uVar3 = (ulong)CS;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,inBuf);
    fprintf(pFVar2,"%s %s: CS=%d inBuf=%s outBuf=%08X count=%d\n",myTimeStamp::buf,"bbSPIXfer",uVar3
            ,myBuf2Str::str,outBuf,(ulong)count);
  }
  pFVar2 = _stderr;
  if (libInitialised == '\0') {
    iVar6 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    pcVar7 = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
LAB_00116923:
    fprintf(pFVar2,pcVar7,myTimeStamp::buf,"bbSPIXfer");
  }
  else {
    if (CS < 0x20) {
      if (wfRx[uVar3].mode == 7) {
        if (inBuf == (char *)0x0 || count == 0) {
          iVar6 = -0x5a;
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x5a;
          }
          myTimeStamp();
          pcVar7 = "%s %s: input buffer can\'t be NULL\n";
        }
        else {
          if (outBuf != (char *)0x0) {
            iVar6 = wfRx[uVar3].field_4.s.readPos;
            w = wfRx + iVar6;
            wfRx[iVar6].field_4.I.SDA = CS;
            wfRx[iVar6].baud = wfRx[uVar3].baud;
            *(undefined8 *)((long)&wfRx[iVar6].field_4 + 0x14) =
                 *(undefined8 *)((long)&wfRx[uVar3].field_4 + 0x14);
            wfRx_lock(iVar6);
            clear_SCLK(w);
            SPI_delay(w);
            uVar1 = wfRx[iVar6].field_4.I.SDA;
            lVar8 = 0x28;
            lVar4 = 0x1c;
            if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x18) & 4) == 0) {
              lVar4 = lVar8;
            }
            *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar4) = 1 << ((byte)uVar1 & 0x1f);
            SPI_delay(w);
            for (uVar3 = 0; uVar3 != count; uVar3 = uVar3 + 1) {
              bVar10 = inBuf[uVar3];
              if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x18) & 1) == 0) {
                cVar5 = '\b';
                bVar9 = 0;
                while (bVar11 = cVar5 != '\0', cVar5 = cVar5 + -1, bVar11) {
                  uVar1 = wfRx[iVar6].field_4.s.bufSize;
                  if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x19) & 0x40) == 0) {
                    lVar4 = 0x1c;
                    if (-1 < (char)bVar10) {
                      lVar4 = lVar8;
                    }
                    *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar4) =
                         1 << ((byte)uVar1 & 0x1f);
                    bVar10 = bVar10 * '\x02';
                  }
                  else {
                    lVar4 = 0x1c;
                    if ((bVar10 & 1) == 0) {
                      lVar4 = lVar8;
                    }
                    *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar4) =
                         1 << ((byte)uVar1 & 0x1f);
                    bVar10 = (char)bVar10 >> 1;
                  }
                  SPI_delay(w);
                  set_SCLK(w);
                  if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x19) & 0x80) == 0) {
                    uVar1 = wfRx[iVar6].field_4.I.SCL;
                    bVar9 = ((gpioReg[(ulong)(uVar1 >> 5) + 0xd] >> (uVar1 & 0x1f) & 1) != 0) +
                            bVar9 * '\x02';
                  }
                  else {
                    uVar1 = wfRx[iVar6].field_4.I.SCL;
                    bVar9 = bVar9 >> 1 |
                            (char)(gpioReg[(ulong)(uVar1 >> 5) + 0xd] >> ((byte)uVar1 & 0x1f)) << 7;
                  }
                  SPI_delay(w);
                  clear_SCLK(w);
                }
              }
              else {
                cVar5 = '\b';
                bVar9 = 0;
                while (bVar11 = cVar5 != '\0', cVar5 = cVar5 + -1, bVar11) {
                  set_SCLK(w);
                  uVar1 = wfRx[iVar6].field_4.s.bufSize;
                  if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x19) & 0x40) == 0) {
                    lVar4 = 0x1c;
                    if (-1 < (char)bVar10) {
                      lVar4 = lVar8;
                    }
                    *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar4) =
                         1 << ((byte)uVar1 & 0x1f);
                    bVar10 = bVar10 * '\x02';
                  }
                  else {
                    lVar4 = 0x1c;
                    if ((bVar10 & 1) == 0) {
                      lVar4 = lVar8;
                    }
                    *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar4) =
                         1 << ((byte)uVar1 & 0x1f);
                    bVar10 = (char)bVar10 >> 1;
                  }
                  SPI_delay(w);
                  clear_SCLK(w);
                  if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x19) & 0x80) == 0) {
                    uVar1 = wfRx[iVar6].field_4.I.SCL;
                    bVar9 = ((gpioReg[(ulong)(uVar1 >> 5) + 0xd] >> (uVar1 & 0x1f) & 1) != 0) +
                            bVar9 * '\x02';
                  }
                  else {
                    uVar1 = wfRx[iVar6].field_4.I.SCL;
                    bVar9 = bVar9 >> 1 |
                            (char)(gpioReg[(ulong)(uVar1 >> 5) + 0xd] >> ((byte)uVar1 & 0x1f)) << 7;
                  }
                  SPI_delay(w);
                }
              }
              outBuf[uVar3] = bVar9;
            }
            SPI_delay(w);
            uVar1 = wfRx[iVar6].field_4.I.SDA;
            if ((*(byte *)((long)&wfRx[iVar6].field_4 + 0x18) & 4) == 0) {
              lVar8 = 0x1c;
            }
            *(int *)((long)gpioReg + (ulong)(uVar1 >> 5) * 4 + lVar8) = 1 << ((byte)uVar1 & 0x1f);
            SPI_delay(w);
            clear_SCLK(w);
            wfRx_unlock(iVar6);
            return count;
          }
          iVar6 = -0x5a;
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x5a;
          }
          myTimeStamp();
          pcVar7 = "%s %s: output buffer can\'t be NULL\n";
        }
        goto LAB_00116923;
      }
      iVar6 = -0x8e;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x8e;
      }
      myTimeStamp();
      pcVar7 = "%s %s: no SPI on gpio (%d)\n";
    }
    else {
      iVar6 = -2;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -2;
      }
      myTimeStamp();
      pcVar7 = "%s %s: bad gpio (%d)\n";
    }
    fprintf(pFVar2,pcVar7,myTimeStamp::buf,"bbSPIXfer",uVar3);
  }
  return iVar6;
}

Assistant:

int bbSPIXfer(
   unsigned CS,
   char *inBuf,
   char *outBuf,
   unsigned count)
{
   int SCLK;
   int pos;
   wfRx_t *w;

   DBG(DBG_USER, "CS=%d inBuf=%s outBuf=%08X count=%d",
      CS, myBuf2Str(count, (char *)inBuf), (int)outBuf, count);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   if (wfRx[CS].mode != PI_WFRX_SPI_CS)
      SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

   if (!inBuf || !count)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && count)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   SCLK = wfRx[CS].S.SCLK;

   wfRx[SCLK].S.CS = CS;
   wfRx[SCLK].baud = wfRx[CS].baud;
   wfRx[SCLK].S.delay = wfRx[CS].S.delay;
   wfRx[SCLK].S.spiFlags = wfRx[CS].S.spiFlags;

   w = &wfRx[SCLK];

   wfRx_lock(SCLK);

   bbSPIStart(w);
     
   for (pos=0; pos < count; pos++)
   {
      outBuf[pos] = bbSPIXferByte(w, inBuf[pos]);
   }

   bbSPIStop(w);

   wfRx_unlock(SCLK);

   return count;
}